

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O1

void __thiscall smf::MidiEventList::removeEmpties(MidiEventList *this)

{
  MidiEvent *this_00;
  pointer ppMVar1;
  pointer ppMVar2;
  pointer ppMVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> newlist;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> local_48;
  
  ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3;
  if ((int)lVar5 < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      this_00 = ppMVar2[lVar5];
      if ((this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this_00->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        MidiEvent::~MidiEvent(this_00);
        operator_delete(this_00);
        (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
        .super__Vector_impl_data._M_start[lVar5] = (MidiEvent *)0x0;
        iVar4 = iVar4 + 1;
      }
      lVar5 = lVar5 + 1;
      ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->list).
                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppMVar2;
    } while (lVar5 < (int)(uVar6 >> 3));
    lVar5 = (long)uVar6 >> 3;
  }
  if (iVar4 != 0) {
    local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve
              (&local_48,lVar5 - iVar4);
    ppMVar2 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppMVar3 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppMVar3 - (long)ppMVar2) >> 3)) {
      lVar7 = 0;
      lVar5 = 0;
      do {
        if (*(MidiEvent **)((long)ppMVar2 + lVar7) != (MidiEvent *)0x0) {
          if (local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
            _M_realloc_insert<smf::MidiEvent*const&>
                      ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)&local_48,
                       (iterator)
                       local_48.
                       super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                       (MidiEvent **)((long)ppMVar2 + lVar7));
          }
          else {
            *local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = *(MidiEvent **)((long)ppMVar2 + lVar7);
            local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl
            .super__Vector_impl_data._M_finish =
                 local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        lVar5 = lVar5 + 1;
        ppMVar2 = (this->list).
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppMVar3 = (this->list).
                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar7 = lVar7 + 8;
      } while (lVar5 < (int)((ulong)((long)ppMVar3 - (long)ppMVar2) >> 3));
    }
    ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    if (ppMVar2 != (pointer)0x0) {
      local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppMVar2;
      local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppMVar3;
      local_48.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = ppMVar1;
      operator_delete(ppMVar2);
    }
  }
  return;
}

Assistant:

void MidiEventList::removeEmpties(void) {
	int count = 0;
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i]->empty()) {
			delete list[i];
			list[i] = NULL;
			count++;
		}
	}
	if (count == 0) {
		return;
	}
	std::vector<MidiEvent*> newlist;
	newlist.reserve(list.size() - count);
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i]) {
			newlist.push_back(list[i]);
		}
	}
	list.swap(newlist);
}